

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  bool bVar5;
  byte *pbVar6;
  long lVar7;
  
  pbVar3 = (byte *)this->end_;
  pbVar6 = (byte *)this->current_;
  while (((pbVar6 != pbVar3 && ((ulong)*pbVar6 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    this->current_ = (Location)pbVar6;
  }
  token->start_ = (Location)pbVar6;
  if (pbVar6 == pbVar3) {
LAB_004a84ef:
    token->type_ = tokenEndOfStream;
    goto LAB_004a8565;
  }
  pbVar1 = pbVar6 + 1;
  this->current_ = (Location)pbVar1;
  bVar2 = *pbVar6;
  if (0x5a < bVar2) {
    if (bVar2 < 0x6e) {
      if (bVar2 == 0x5b) {
        token->type_ = tokenArrayBegin;
        goto LAB_004a8565;
      }
      if (bVar2 == 0x5d) {
        token->type_ = tokenArrayEnd;
        goto LAB_004a8565;
      }
      if ((bVar2 == 0x66) && (token->type_ = tokenFalse, 3 < (long)pbVar3 - (long)pbVar1)) {
        lVar7 = 4;
        do {
          if (lVar7 == 0) {
            pbVar6 = pbVar6 + 5;
            goto LAB_004a859c;
          }
          pbVar3 = pbVar6 + lVar7;
          pbVar1 = (byte *)("False" + lVar7);
          lVar7 = lVar7 + -1;
        } while (*pbVar3 == *pbVar1);
      }
    }
    else if (bVar2 < 0x7b) {
      if (bVar2 == 0x6e) {
        token->type_ = tokenNull;
        if (2 < (long)pbVar3 - (long)pbVar1) {
          lVar7 = 3;
          do {
            if (lVar7 == 0) goto LAB_004a8592;
            pbVar3 = pbVar6 + lVar7;
            lVar4 = lVar7 + 7;
            lVar7 = lVar7 + -1;
          } while (*pbVar3 == "--help-full"[lVar4]);
        }
      }
      else if ((bVar2 == 0x74) && (token->type_ = tokenTrue, 2 < (long)pbVar3 - (long)pbVar1)) {
        lVar7 = 3;
        do {
          if (lVar7 == 0) goto LAB_004a8592;
          pbVar3 = pbVar6 + lVar7;
          pbVar1 = (byte *)("True" + lVar7);
          lVar7 = lVar7 + -1;
        } while (*pbVar3 == *pbVar1);
      }
    }
    else {
      if (bVar2 == 0x7d) {
        token->type_ = tokenObjectEnd;
        goto LAB_004a8565;
      }
      if (bVar2 == 0x7b) {
        token->type_ = tokenObjectBegin;
        goto LAB_004a8565;
      }
    }
    goto switchD_004a8403_caseD_23;
  }
  switch(bVar2) {
  case 0x22:
    token->type_ = tokenString;
    bVar5 = readString(this);
    goto LAB_004a8515;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_004a8565;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this);
    goto LAB_004a8565;
  case 0x2f:
    token->type_ = tokenComment;
    bVar5 = readComment(this);
LAB_004a8515:
    if (bVar5 != false) goto LAB_004a8565;
    break;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    goto LAB_004a8565;
  default:
    if (bVar2 == 0) goto LAB_004a84ef;
  }
switchD_004a8403_caseD_23:
  token->type_ = tokenError;
LAB_004a8565:
  token->end_ = this->current_;
  return true;
LAB_004a8592:
  pbVar6 = pbVar6 + 4;
LAB_004a859c:
  this->current_ = (Location)pbVar6;
  goto LAB_004a8565;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}